

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WAsmjsUtils.cpp
# Opt level: O0

void WAsmJs::JitFunctionIfReady(ScriptFunction *func,uint interpretedCount)

{
  bool bVar1;
  uint sourceContextId;
  LocalFunctionId functionId;
  int iVar2;
  FunctionBody *body_00;
  undefined4 extraout_var;
  ScriptContext *this;
  NativeCodeGenerator *nativeCodeGen;
  FunctionBody *body;
  uint interpretedCount_local;
  ScriptFunction *func_local;
  
  body_00 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)func);
  bVar1 = ShouldJitFunction(body_00,interpretedCount);
  if (bVar1) {
    sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)body_00);
    functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)body_00);
    bVar1 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01ec1678,AsmjsEntryPointInfoPhase,sourceContextId,functionId);
    if (bVar1) {
      iVar2 = (*(body_00->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
      Output::Print(L"Scheduling %s For Full JIT at callcount:%d\n",CONCAT44(extraout_var,iVar2),
                    (ulong)interpretedCount);
    }
    this = Js::FunctionProxy::GetScriptContext((FunctionProxy *)body_00);
    nativeCodeGen = Js::ScriptContext::GetNativeCodeGenerator(this);
    GenerateFunction(nativeCodeGen,body_00,func);
    Js::FunctionBody::SetIsAsmJsFullJitScheduled(body_00,true);
  }
  return;
}

Assistant:

void JitFunctionIfReady(Js::ScriptFunction* func, uint interpretedCount /*= 0*/)
    {
#if ENABLE_NATIVE_CODEGEN
        Js::FunctionBody* body = func->GetFunctionBody();
        if (WAsmJs::ShouldJitFunction(body, interpretedCount))
        {
            if (PHASE_TRACE(Js::AsmjsEntryPointInfoPhase, body))
            {
                Output::Print(_u("Scheduling %s For Full JIT at callcount:%d\n"), body->GetDisplayName(), interpretedCount);
            }
            GenerateFunction(body->GetScriptContext()->GetNativeCodeGenerator(), body, func);
            body->SetIsAsmJsFullJitScheduled(true);
        }
#endif
    }